

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexfloat.c
# Opt level: O1

uint_t flexfloat_pack(flexfloat_desc_t desc,_Bool sign,int_fast16_t exp,uint_t frac)

{
  long lVar1;
  
  lVar1 = 0x7ff0000000000000;
  if ((-1L << (desc.exp_bits & 0x3f) ^ exp) != 0xffffffffffffffff) {
    lVar1 = ((ulong)((int)exp + (int)(-1L << (desc.exp_bits - 1 & 0x3f)) + 1) << 0x34) +
            0x3ff0000000000000;
  }
  return (frac << (0x34 - desc.frac_bits & 0x3f)) + ((ulong)sign << 0x3f) + lVar1;
}

Assistant:

uint_t flexfloat_pack(flexfloat_desc_t desc, bool sign, int_fast16_t exp, uint_t frac)
{
    int_fast16_t bias    = flexfloat_bias(desc);
    int_fast16_t inf_exp = flexfloat_inf_exp(desc);

    if(exp == inf_exp)   // Inf or NaN
    {
        exp = INF_EXP;
    }
    else
    {
        exp = (exp - bias) + BIAS;
    }
    return PACK(sign, exp, frac << (NUM_BITS_FRAC - desc.frac_bits));
}